

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O3

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec2i *pts,TGAColor *colors)

{
  uint uVar1;
  vec<2,_float,_(glm::qualifier)0> A;
  vec<2,_float,_(glm::qualifier)0> P;
  TinyRender *pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint x;
  int iVar8;
  bool bVar9;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar10;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar11;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar12;
  vec<2,_float,_(glm::qualifier)0> B;
  vec<2,_float,_(glm::qualifier)0> C;
  Vec3f VVar13;
  TGAColor c;
  TGAColor local_68;
  int local_60;
  int local_5c;
  ulong local_58;
  TinyRender *local_50;
  undefined1 local_48 [16];
  
  iVar3 = TGAImage::get_width(*(TGAImage **)(this + 8));
  x = iVar3 - 1;
  iVar3 = TGAImage::get_height(*(TGAImage **)(this + 8));
  iVar3 = iVar3 + -1;
  iVar4 = TGAImage::get_width(*(TGAImage **)(this + 8));
  local_50 = this;
  iVar5 = TGAImage::get_height(*(TGAImage **)(this + 8));
  iVar5 = iVar5 + -1;
  local_58 = 0;
  lVar7 = 0;
  local_5c = 0;
  do {
    iVar6 = local_5c;
    iVar8 = pts[lVar7].field_1.y;
    if (iVar8 < iVar3) {
      iVar3 = iVar8;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    uVar1 = pts[lVar7].field_0.x;
    if ((int)local_58 <= (int)uVar1) {
      local_58 = (ulong)uVar1;
    }
    if ((int)(iVar4 - 1U) <= (int)local_58) {
      local_58 = (ulong)(iVar4 - 1U);
    }
    if ((int)uVar1 < (int)x) {
      x = uVar1;
    }
    if ((int)x < 1) {
      x = 0;
    }
    local_5c = iVar8;
    if (iVar8 < iVar6) {
      local_5c = iVar6;
    }
    if (iVar5 <= local_5c) {
      local_5c = iVar5;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_60 = iVar3;
  TGAImage::get_width(*(TGAImage **)(local_50 + 8));
  pTVar2 = local_50;
  if ((int)x <= (int)(uint)local_58) {
    if (iVar8 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar5 <= iVar8) {
      iVar8 = iVar5;
    }
    do {
      if (local_60 <= local_5c) {
        local_48 = ZEXT416((uint)(float)(int)x);
        iVar3 = local_60;
        do {
          B.field_0.x = (float)pts[1].field_0.x;
          B.field_1.y = (float)pts[1].field_1.y;
          C.field_0.x = (float)pts[2].field_0.x;
          C.field_1.y = (float)pts[2].field_1.y;
          A.field_1.y = (float)(*pts).field_1.y;
          A.field_0.x = (float)(*pts).field_0.x;
          P.field_1.y = (float)iVar3;
          P.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)local_48._0_4_
          ;
          VVar13 = barycentric<2ul>(A,B,C,P);
          aVar12 = VVar13.field_2;
          aVar10 = VVar13.field_0;
          aVar11 = VVar13.field_1;
          if (((0.0 <= aVar10.x) && (0.0 <= aVar11.y)) && (0.0 <= aVar12.z)) {
            local_68.bytespp = '\x01';
            local_68.bgra[1] =
                 (uchar)(int)((float)colors[2].bgra[1] * aVar12.z +
                             (float)colors->bgra[1] * aVar10.x + (float)colors[1].bgra[1] * aVar11.y
                             );
            local_68.bgra[0] =
                 (uchar)(int)((float)colors[2].bgra[0] * aVar12.z +
                             (float)colors->bgra[0] * aVar10.x + (float)colors[1].bgra[0] * aVar11.y
                             );
            local_68.bgra[2] =
                 (char)(int)((float)colors[2].bgra[2] * aVar12.z +
                            (float)colors->bgra[2] * aVar10.x + (float)colors[1].bgra[2] * aVar11.y)
            ;
            local_68.bgra[3] = '\0';
            TGAImage::set(*(TGAImage **)(pTVar2 + 8),x,iVar3,&local_68);
          }
          iVar3 = iVar3 + 1;
        } while (iVar8 + 1 != iVar3);
      }
      bVar9 = x != (uint)local_58;
      x = x + 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec2i* pts, TGAColor* colors) {
  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  int width = mImage->get_width();

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;
      TGAColor c;
      /*
              barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];
      mImage->set(p[0], p[1], c);
    }
  }
}